

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  __index_type *p_Var1;
  ostream *poVar2;
  undefined1 local_88 [8];
  Ast post_eval;
  Ast pre_eval;
  anon_class_8_1_898ba27a local_58;
  undefined1 local_50 [8];
  Parse_ast parse;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  file;
  char **argv_local;
  int argc_local;
  
  p_Var1 = (__index_type *)
           ((long)&parse.underlying_.
                   super__Variant_base<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   .
                   super__Move_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   .
                   super__Copy_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   .
                   super__Move_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   .
                   super__Copy_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
           + 0x28);
  get_program((int)p_Var1,(char **)(ulong)(uint)argc);
  local_58.file =
       (unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
        *)p_Var1;
  main::anon_class_8_1_898ba27a::operator()((Parse_ast *)local_50,&local_58);
  poVar2 = std::operator<<((ostream *)&std::cout,"parse: ");
  poVar2 = lambda::operator<<(poVar2,(Parse_ast *)local_50);
  std::operator<<(poVar2,"\n\n");
  lambda::reduce((lambda *)
                 &post_eval.underlying_.
                  super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(Parse_ast *)local_50);
  poVar2 = std::operator<<((ostream *)&std::cout,"typed: ");
  poVar2 = lambda::operator<<(poVar2,(Ast *)&post_eval.underlying_.
                                             super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount);
  std::operator<<(poVar2,"\n\n");
  lambda::eval((lambda *)local_88,
               (Ast *)&post_eval.underlying_.
                       super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
  poVar2 = std::operator<<((ostream *)&std::cout,"eval\'d: ");
  poVar2 = lambda::operator<<(poVar2,(Ast *)local_88);
  std::operator<<(poVar2,'\n');
  lambda::Ast::~Ast((Ast *)local_88);
  lambda::Ast::~Ast((Ast *)&post_eval.underlying_.
                            super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  lambda::Parse_ast::~Parse_ast((Parse_ast *)local_50);
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                 *)((long)&parse.underlying_.
                           super__Variant_base<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           .
                           super__Move_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           .
                           super__Copy_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           .
                           super__Move_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           .
                           super__Copy_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                   + 0x28));
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  auto file = get_program(argc, argv);

  auto parse = [&] {
    try {
      return lambda::parse_from(*file);
    } catch (lambda::Parse_error const& e) {
      ublib::failwith(e);
    }
  }();

  std::cout << "parse: " << parse << "\n\n";

  auto const pre_eval = lambda::reduce(parse);
  std::cout << "typed: " << pre_eval << "\n\n";   

  auto const post_eval = eval(pre_eval);
  std::cout << "eval'd: " << post_eval << '\n';
}